

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_pass_filter_impl.cc
# Opt level: O1

void __thiscall
webrtc::HighPassFilterImpl::ProcessCaptureAudio(HighPassFilterImpl *this,AudioBuffer *audio)

{
  BiquadFilter *this_00;
  int16_t *data;
  string *psVar1;
  pointer puVar2;
  int16_t **ppiVar3;
  size_t length;
  ostream *poVar4;
  size_t channel;
  CritScope cs;
  ulong local_1b0;
  CritScope local_1a8;
  FatalMessage local_1a0;
  
  if (audio == (AudioBuffer *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/high_pass_filter_impl.cc"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Check failed: audio",0x13);
    std::ios::widen((char)(ostream *)&local_1a0 + (char)*(undefined8 *)(local_1a0._0_8_ - 0x18));
    std::ostream::put((char)&local_1a0);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"# ",2);
  }
  else {
    rtc::CritScope::CritScope(&local_1a8,this->crit_);
    if (this->enabled_ != true) {
LAB_0017fee7:
      rtc::CritScope::~CritScope(&local_1a8);
      return;
    }
    local_1b0 = CONCAT44(local_1b0._4_4_,0xa0);
    local_1a0._0_8_ = AudioBuffer::num_frames_per_band(audio);
    if ((local_1b0 & 0xffffffff) < (ulong)local_1a0._0_8_) {
      psVar1 = rtc::MakeCheckOpString<unsigned_int,unsigned_long>
                         ((uint *)&local_1b0,(unsigned_long *)&local_1a0,
                          "160u >= audio->num_frames_per_band()");
    }
    else {
      psVar1 = (string *)0x0;
    }
    if (psVar1 == (string *)0x0) {
      local_1a0._0_8_ =
           (long)(this->filters_).
                 super__Vector_base<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>,_std::allocator<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->filters_).
                 super__Vector_base<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>,_std::allocator<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
      local_1b0 = AudioBuffer::num_channels(audio);
      if (local_1a0._0_8_ == local_1b0) {
        psVar1 = (string *)0x0;
      }
      else {
        psVar1 = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                           ((unsigned_long *)&local_1a0,&local_1b0,
                            "filters_.size() == audio->num_channels()");
      }
      if (psVar1 == (string *)0x0) {
        puVar2 = (this->filters_).
                 super__Vector_base<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>,_std::allocator<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->filters_).
            super__Vector_base<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>,_std::allocator<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
          channel = 0;
          do {
            this_00 = puVar2[channel]._M_t.
                      super___uniq_ptr_impl<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_webrtc::HighPassFilterImpl::BiquadFilter_*,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>
                      .super__Head_base<0UL,_webrtc::HighPassFilterImpl::BiquadFilter_*,_false>.
                      _M_head_impl;
            ppiVar3 = AudioBuffer::split_bands(audio,channel);
            data = *ppiVar3;
            length = AudioBuffer::num_frames_per_band(audio);
            BiquadFilter::Process(this_00,data,length);
            channel = channel + 1;
            puVar2 = (this->filters_).
                     super__Vector_base<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>,_std::allocator<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          } while (channel < (ulong)((long)(this->filters_).
                                           super__Vector_base<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>,_std::allocator<std::unique_ptr<webrtc::HighPassFilterImpl::BiquadFilter,_std::default_delete<webrtc::HighPassFilterImpl::BiquadFilter>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2
                                    >> 3));
        }
        goto LAB_0017fee7;
      }
      rtc::FatalMessage::FatalMessage
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/high_pass_filter_impl.cc"
                 ,0x70,psVar1);
    }
    else {
      rtc::FatalMessage::FatalMessage
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/high_pass_filter_impl.cc"
                 ,0x6f,psVar1);
    }
  }
  rtc::FatalMessage::~FatalMessage(&local_1a0);
}

Assistant:

void HighPassFilterImpl::ProcessCaptureAudio(AudioBuffer* audio) {
  RTC_DCHECK(audio);
  rtc::CritScope cs(crit_);
  if (!enabled_) {
    return;
  }

  RTC_DCHECK_GE(160u, audio->num_frames_per_band());
  RTC_DCHECK_EQ(filters_.size(), audio->num_channels());
  for (size_t i = 0; i < filters_.size(); i++) {
    filters_[i]->Process(audio->split_bands(i)[kBand0To8kHz],
                         audio->num_frames_per_band());
  }
}